

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O3

bool deqp::gls::StateQueryUtil::checkError(ResultCollector *result,CallLogWrapper *gl,char *msg)

{
  size_type *psVar1;
  GLenum GVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  allocator<char> local_b1;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  code *local_30;
  GLenum local_28;
  
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 == 0) goto LAB_007ca185;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,msg,&local_b1);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_80 = *puVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar5;
    local_90 = (ulong *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_30 = glu::getErrorName;
  local_28 = GVar2;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
  uVar6 = 0xf;
  if (local_90 != &local_80) {
    uVar6 = local_80;
  }
  if (uVar6 < local_70._M_string_length + local_88) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar7 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_70._M_string_length + local_88) goto LAB_007ca0af;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_007ca0af:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_b0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ResultCollector::fail(result,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_007ca185:
  return GVar2 == 0;
}

Assistant:

static bool checkError (tcu::ResultCollector& result, glu::CallLogWrapper& gl, const char* msg)
{
	const glw::GLenum errorCode = gl.glGetError();

	if (errorCode == GL_NO_ERROR)
		return true;

	result.fail(std::string(msg) + ": glGetError() returned " + glu::getErrorStr(errorCode).toString());
	return false;
}